

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlistmodel.cpp
# Opt level: O0

QMap<int,_QVariant> __thiscall QStringListModel::itemData(QStringListModel *this,QModelIndex *index)

{
  long lVar1;
  initializer_list<std::pair<int,_QVariant>_> list;
  bool bVar2;
  QMap<int,_QVariant> *this_00;
  QModelIndex *in_RDX;
  long in_RSI;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
  in_RDI;
  long in_FS_OFFSET;
  QVariant displayData;
  CheckIndexOptions in_stack_000001dc;
  QString *in_stack_fffffffffffffeb8;
  enum_type in_stack_fffffffffffffec0;
  enum_type in_stack_fffffffffffffec4;
  int *in_stack_fffffffffffffec8;
  undefined1 **local_100;
  iterator ppVar3;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
  __s;
  undefined1 *local_78 [10];
  undefined1 *local_28;
  undefined8 in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __s.d.ptr = in_RDI.d.ptr;
  ::operator|(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0);
  bVar2 = QAbstractItemModel::checkIndex
                    ((QAbstractItemModel *)in_stack_ffffffffffffffe8,
                     (QModelIndex *)in_stack_ffffffffffffffe0,in_stack_000001dc);
  if (bVar2) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    this_00 = (QMap<int,_QVariant> *)(in_RSI + 0x10);
    QModelIndex::row(in_RDX);
    QList<QString>::at((QList<QString> *)
                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       (qsizetype)in_stack_fffffffffffffeb8);
    ppVar3 = (iterator)&local_28;
    ::QVariant::QVariant
              ((QVariant *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               in_stack_fffffffffffffeb8);
    std::make_pair<int,QVariant_const&>
              (in_stack_fffffffffffffec8,
               (QVariant *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    std::make_pair<int,QVariant_const&>
              (in_stack_fffffffffffffec8,
               (QVariant *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    list._M_len = (size_type)__s.d.ptr;
    list._M_array = ppVar3;
    QMap<int,_QVariant>::QMap(this_00,list);
    local_100 = &local_28;
    do {
      local_100 = local_100 + -5;
      std::pair<int,_QVariant>::~pair((pair<int,_QVariant> *)0x8baad8);
    } while (local_100 != local_78);
    ::QVariant::~QVariant((QVariant *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0))
    ;
  }
  else {
    memset((void *)__s.d.ptr,0,8);
    QMap<int,_QVariant>::QMap((QMap<int,_QVariant> *)0x8ba9b6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
            )(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
              )in_RDI.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QMap<int, QVariant> QStringListModel::itemData(const QModelIndex &index) const
{
    if (!checkIndex(index, CheckIndexOption::IndexIsValid | CheckIndexOption::ParentIsInvalid))
        return QMap<int, QVariant>{};
    const QVariant displayData = lst.at(index.row());
    return QMap<int, QVariant>{{
        std::make_pair<int>(Qt::DisplayRole, displayData),
        std::make_pair<int>(Qt::EditRole, displayData)
    }};
}